

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChShaftsMotorAngle.cpp
# Opt level: O1

void __thiscall
chrono::ChShaftsMotorAngle::ConstraintsBiLoad_C
          (ChShaftsMotorAngle *this,double factor,double recovery_clamp,bool do_clamp)

{
  undefined1 auVar1 [16];
  double dVar2;
  double dVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  
  dVar2 = factor;
  (*(this->super_ChShaftsMotorBase).super_ChShaftsCouple.super_ChPhysicsItem.super_ChObj._vptr_ChObj
    [0x40])(factor,recovery_clamp);
  dVar3 = (this->super_ChShaftsMotorBase).super_ChShaftsCouple.super_ChPhysicsItem.super_ChObj.
          ChTime;
  (*((this->f_rot).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    _vptr_ChFunction[4])();
  auVar5._8_8_ = 0;
  auVar5._0_8_ = factor;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (this->constraint).super_ChConstraintTwo.super_ChConstraint.b_i;
  auVar4._8_8_ = 0;
  auVar4._0_8_ = ((dVar2 - dVar3) - this->rot_offset) * factor;
  auVar1 = vfmadd213sd_fma(auVar4,auVar5,auVar1);
  (this->constraint).super_ChConstraintTwo.super_ChConstraint.b_i = auVar1._0_8_;
  return;
}

Assistant:

void ChShaftsMotorAngle::ConstraintsBiLoad_C(double factor, double recovery_clamp, bool do_clamp) {

    double res = factor * (GetMotorRot()  - this->f_rot->Get_y(this->GetChTime()) - this->rot_offset);

    constraint.Set_b_i(constraint.Get_b_i() + factor * res);
}